

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_dpb.c
# Opt level: O1

int cmp_lt_list(void *p0,void *p1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = *(int *)(*p0 + 0x24);
  iVar1 = *(int *)(*p1 + 0x24);
  iVar3 = ((iVar1 < iVar2) - 1) + (uint)(iVar1 < iVar2);
  if (iVar2 == iVar1) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int cmp_lt_list(const void *p0, const void *p1)
{
    H264eDpbFrm *frm0 = *(H264eDpbFrm **)p0;
    H264eDpbFrm *frm1 = *(H264eDpbFrm **)p1;

    if (frm0->lt_idx == frm1->lt_idx)
        return 0;
    if (frm0->lt_idx > frm1->lt_idx)
        return 1;
    else
        return -1;
}